

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamio.c
# Opt level: O0

Bool tidyInitSource(TidyInputSource *source,void *srcData,TidyGetByteFunc gbFunc,
                   TidyUngetByteFunc ugbFunc,TidyEOFFunc endFunc)

{
  bool local_35;
  Bool status;
  TidyEOFFunc endFunc_local;
  TidyUngetByteFunc ugbFunc_local;
  TidyGetByteFunc gbFunc_local;
  void *srcData_local;
  TidyInputSource *source_local;
  
  local_35 = false;
  if ((((source != (TidyInputSource *)0x0) && (local_35 = false, srcData != (void *)0x0)) &&
      (local_35 = false, gbFunc != (TidyGetByteFunc)0x0)) &&
     (local_35 = false, ugbFunc != (TidyUngetByteFunc)0x0)) {
    local_35 = endFunc != (TidyEOFFunc)0x0;
  }
  if (local_35 != no) {
    source->sourceData = srcData;
    source->getByte = gbFunc;
    source->ungetByte = ugbFunc;
    source->eof = endFunc;
  }
  return (uint)local_35;
}

Assistant:

Bool TIDY_CALL tidyInitSource( TidyInputSource*  source,
                               void*             srcData,
                               TidyGetByteFunc   gbFunc,
                               TidyUngetByteFunc ugbFunc,
                               TidyEOFFunc       endFunc )
{
  Bool status = ( source && srcData && gbFunc && ugbFunc && endFunc );

  if ( status )
  {
    source->sourceData = srcData;
    source->getByte    = gbFunc;
    source->ungetByte  = ugbFunc;
    source->eof        = endFunc;
  }

  return status;
}